

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_boxtype.cxx
# Opt level: O2

void __thiscall Fl_Widget::draw_backdrop(Fl_Widget *this)

{
  int iVar1;
  Fl_Image *this_00;
  
  if ((((this->label_).align_ & 0x200) == 0) ||
     (this_00 = (this->label_).image, this_00 == (Fl_Image *)0x0)) {
    return;
  }
  if (((this->label_).deimage != (Fl_Image *)0x0) &&
     ((iVar1 = active_r(this), iVar1 == 0 &&
      (this_00 = (this->label_).deimage, this_00 == (Fl_Image *)0x0)))) {
    return;
  }
  Fl_Image::draw(this_00,(this->w_ - this_00->w_) / 2 + this->x_,
                 (this->h_ - this_00->h_) / 2 + this->y_);
  return;
}

Assistant:

void Fl_Widget::draw_backdrop() const {
  if (align() & FL_ALIGN_IMAGE_BACKDROP) {
    const Fl_Image *img = image();
    // if there is no image, we will not draw the deimage either
    if (img && deimage() && !active_r())
      img = deimage();
    if (img)
      ((Fl_Image*)img)->draw(x_+(w_-img->w())/2, y_+(h_-img->h())/2);
  }
}